

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
wallet::anon_unknown_5::WalletImpl::handleTransactionChanged
          (WalletImpl *this,TransactionChangedFn *fn)

{
  element_type *peVar1;
  function<void_(const_uint256_&,_ChangeType)> *in_RDX;
  _Head_base<0UL,_interfaces::Handler_*,_false> in_RDI;
  long in_FS_OFFSET;
  slot<void_(const_uint256_&,_ChangeType),_boost::function<void_(const_uint256_&,_ChangeType)>_>
  *in_stack_ffffffffffffff38;
  int __fd;
  functor_type *f;
  slot<void_(const_uint256_&,_ChangeType),_boost::function<void_(const_uint256_&,_ChangeType)>_>
  *in_stack_ffffffffffffff68;
  functor_type local_70;
  sockaddr local_50 [3];
  signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
  local_18;
  signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
  *this_00;
  
  local_18._pimpl.pn.pi_ = *(sp_counted_base **)(in_FS_OFFSET + 0x28);
  peVar1 = _GLOBAL__N_1::std::
           __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_stack_ffffffffffffff38);
  this_00 = &peVar1->NotifyTransactionChanged;
  f = &local_70;
  _GLOBAL__N_1::std::function<void_(const_uint256_&,_ChangeType)>::function
            ((function<void_(const_uint256_&,_ChangeType)> *)this_00,in_RDX);
  __fd = (int)this_00;
  boost::signals2::
  slot<void(uint256_const&,ChangeType),boost::function<void(uint256_const&,ChangeType)>>::
  slot<wallet::(anonymous_namespace)::WalletImpl::handleTransactionChanged(std::function<void(uint256_const&,ChangeType)>)::_lambda(uint256_const&,ChangeType)_1_>
            (in_stack_ffffffffffffff68,f);
  boost::signals2::
  signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
  ::connect(&local_18,__fd,local_50,0);
  interfaces::MakeSignalHandler((connection *)in_RDI._M_head_impl);
  boost::signals2::connection::~connection((connection *)in_stack_ffffffffffffff38);
  boost::signals2::
  slot<void_(const_uint256_&,_ChangeType),_boost::function<void_(const_uint256_&,_ChangeType)>_>::
  ~slot(in_stack_ffffffffffffff38);
  (anonymous_namespace)::WalletImpl::
  handleTransactionChanged(std::function<void(uint256_const&,ChangeType)>)::
  {lambda(uint256_const&,ChangeType)#1}::~function((functor_type *)in_stack_ffffffffffffff38);
  if (*(sp_counted_base **)(in_FS_OFFSET + 0x28) == local_18._pimpl.pn.pi_) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(tuple<interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>)
             in_RDI._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> handleTransactionChanged(TransactionChangedFn fn) override
    {
        return MakeSignalHandler(m_wallet->NotifyTransactionChanged.connect(
            [fn](const uint256& txid, ChangeType status) { fn(txid, status); }));
    }